

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMove5<(moira::Instr)71,(moira::Mode)7,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  StrWriter *in_RSI;
  long in_RDI;
  Ea<(moira::Mode)5,_(moira::Size)4> dst;
  Ea<(moira::Mode)7,_(moira::Size)4> src;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined6 in_stack_ffffffffffffffb8;
  u16 in_stack_ffffffffffffffbe;
  Moira *in_stack_ffffffffffffffc0;
  Ea<(moira::Mode)5,_(moira::Size)4> *in_stack_ffffffffffffffc8;
  StrWriter *in_stack_ffffffffffffffd0;
  
  Op<(moira::Mode)7,(moira::Size)4>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
             (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Op<(moira::Mode)5,(moira::Size)4>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
             (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<
                     ((StrWriter *)in_stack_ffffffffffffffc0,
                      (Ea<(moira::Mode)7,_(moira::Size)4> *)
                      CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
Moira::dasmMove5(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_DI,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}